

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar1;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *value;
  long lVar2;
  LogMessage local_48;
  Voidify local_31;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  void **ppvStack_20;
  int i;
  void **elems;
  RepeatedPtrFieldBase *pRStack_10;
  int n;
  RepeatedPtrFieldBase *this_local;
  
  elems._4_4_ = this->current_size_;
  pRStack_10 = this;
  ppvStack_20 = elements(this);
  absl_log_internal_check_op_result._4_4_ = 0;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(elems._4_4_);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_30 = absl::lts_20250127::log_internal::Check_GTImpl(v1,v2,"n > 0");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x2ca,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  local_30 = (Nullable<const_char_*>)0x0;
  do {
    lVar2 = (long)absl_log_internal_check_op_result._4_4_;
    absl_log_internal_check_op_result._4_4_ = absl_log_internal_check_op_result._4_4_ + 1;
    value = cast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                      (ppvStack_20[lVar2]);
    GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Clear(value);
  } while (absl_log_internal_check_op_result._4_4_ < elems._4_4_);
  ExchangeCurrentSize(this,0);
  return;
}

Assistant:

PROTOBUF_NOINLINE void ClearNonEmpty() {
    const int n = current_size_;
    void* const* elems = elements();
    int i = 0;
    ABSL_DCHECK_GT(n, 0);
    // do/while loop to avoid initial test because we know n > 0
    do {
      TypeHandler::Clear(cast<TypeHandler>(elems[i++]));
    } while (i < n);
    ExchangeCurrentSize(0);
  }